

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O2

timestamp_t duckdb::MakeTimestampOperator::Operation<long,duckdb::timestamp_t>(long value)

{
  ConversionException *this;
  allocator local_39;
  string local_38;
  
  if ((value != 0x7fffffffffffffff) && (value != -0x7fffffffffffffff)) {
    return (timestamp_t)value;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Timestamp microseconds out of range: %ld",&local_39);
  ConversionException::ConversionException<long>(this,&local_38,value);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(T value) {
		const auto result = RESULT_TYPE(value);
		if (!Timestamp::IsFinite(result)) {
			throw ConversionException("Timestamp microseconds out of range: %ld", value);
		}
		return RESULT_TYPE(value);
	}